

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O0

void __thiscall QSQLiteResultPrivate::initColumns(QSQLiteResultPrivate *this,bool emptyResultset)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QSQLiteResult *pQVar4;
  QChar *pQVar5;
  byte in_SIL;
  QSQLiteResultPrivate *in_RDI;
  long in_FS_OFFSET;
  int fieldType;
  int stp;
  int i;
  int nCols;
  QSQLiteResult *q;
  QString typeName;
  QString tableName;
  QString colName;
  QSqlField fld;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  sqlite3_stmt *in_stack_ffffffffffffff00;
  int local_f4;
  undefined4 uVar6;
  int local_e0;
  QMetaType local_c0;
  QString local_b8;
  QChar local_9a;
  QString local_98;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  QChar local_62;
  QString local_60;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  QSqlField local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = q_func(in_RDI);
  iVar2 = sqlite3_column_count(in_RDI->stmt);
  if (0 < iVar2) {
    QSqlCachedResult::init((int)pQVar4);
    for (local_e0 = 0; local_e0 < iVar2; local_e0 = local_e0 + 1) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar5 = (QChar *)sqlite3_column_name16(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      QString::QString(&local_60,pQVar5,-1);
      QChar::QChar<char16_t,_true>(&local_62,L'\"');
      QString::remove((QChar)(char16_t)&local_60,(uint)(ushort)local_62.ucs);
      QString::QString((QString *)in_stack_ffffffffffffff00,
                       (QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      QString::~QString((QString *)0x114798);
      local_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar5 = (QChar *)sqlite3_column_table_name16
                                  (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      QString::QString(&local_98,pQVar5,-1);
      QChar::QChar<char16_t,_true>(&local_9a,L'\"');
      QString::remove((QChar)(char16_t)&local_98,(uint)(ushort)local_9a.ucs);
      QString::QString((QString *)in_stack_ffffffffffffff00,
                       (QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      QString::~QString((QString *)0x11482b);
      local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      pQVar5 = (QChar *)sqlite3_column_decltype16
                                  (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      QString::QString(&local_b8,pQVar5,-1);
      if ((in_SIL & 1) == 0) {
        local_f4 = sqlite3_column_type(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      }
      else {
        local_f4 = -1;
      }
      uVar6 = 0xaaaaaaaa;
      bVar1 = QString::isEmpty((QString *)0x1148bd);
      if (bVar1) {
        in_stack_ffffffffffffff00 = (sqlite3_stmt *)(ulong)(local_f4 - 1);
        switch(in_stack_ffffffffffffff00) {
        case (sqlite3_stmt *)0x0:
          iVar3 = 2;
          break;
        case (sqlite3_stmt *)0x1:
          iVar3 = 6;
          break;
        case (sqlite3_stmt *)0x2:
          iVar3 = 10;
          break;
        case (sqlite3_stmt *)0x3:
          iVar3 = 0xc;
          break;
        case (sqlite3_stmt *)0x4:
        default:
          iVar3 = 0;
        }
      }
      else {
        iVar3 = qGetColumnType((QString *)CONCAT44(local_f4,uVar6));
      }
      memset(local_30,0xaa,0x28);
      QMetaType::QMetaType(&local_c0,iVar3);
      QSqlField::QSqlField(local_30,(QString *)&local_48,local_c0,(QString *)&local_80);
      QSqlRecord::append((QSqlField *)&in_RDI->rInf);
      QSqlField::~QSqlField(local_30);
      QString::~QString((QString *)0x1149a4);
      QString::~QString((QString *)0x1149b1);
      QString::~QString((QString *)0x1149be);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSQLiteResultPrivate::initColumns(bool emptyResultset)
{
    Q_Q(QSQLiteResult);
    int nCols = sqlite3_column_count(stmt);
    if (nCols <= 0)
        return;

    q->init(nCols);

    for (int i = 0; i < nCols; ++i) {
        QString colName = QString(reinterpret_cast<const QChar *>(
                    sqlite3_column_name16(stmt, i))
                    ).remove(u'"');
        const QString tableName = QString(reinterpret_cast<const QChar *>(
                            sqlite3_column_table_name16(stmt, i))
                            ).remove(u'"');
        // must use typeName for resolving the type to match QSqliteDriver::record
        QString typeName = QString(reinterpret_cast<const QChar *>(
                    sqlite3_column_decltype16(stmt, i)));
        // sqlite3_column_type is documented to have undefined behavior if the result set is empty
        int stp = emptyResultset ? -1 : sqlite3_column_type(stmt, i);

        int fieldType;

        if (!typeName.isEmpty()) {
            fieldType = qGetColumnType(typeName);
        } else {
            // Get the proper type for the field based on stp value
            switch (stp) {
            case SQLITE_INTEGER:
                fieldType = QMetaType::Int;
                break;
            case SQLITE_FLOAT:
                fieldType = QMetaType::Double;
                break;
            case SQLITE_BLOB:
                fieldType = QMetaType::QByteArray;
                break;
            case SQLITE_TEXT:
                fieldType = QMetaType::QString;
                break;
            case SQLITE_NULL:
            default:
                fieldType = QMetaType::UnknownType;
                break;
            }
        }

        QSqlField fld(colName, QMetaType(fieldType), tableName);
        rInf.append(fld);
    }
}